

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2sf2rom.cpp
# Opt level: O1

void load_2sf(string *filename,vector<char,_std::allocator<char>_> *rom,int lib_nest_level,
             bool first_load)

{
  char *__name;
  pointer pcVar1;
  vector<char,_std::allocator<char>_> *pvVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  int *piVar6;
  size_t sVar7;
  string *psVar8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  const_iterator cVar9;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *filename_00;
  ssize_t sVar10;
  ssize_t sVar11;
  runtime_error *prVar12;
  ostream *poVar13;
  out_of_range *poVar14;
  uint uVar15;
  undefined7 in_register_00000009;
  ulong __nbytes;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ostringstream *this_01;
  exception anon_var_0;
  ostringstream message_buffer_2;
  ZlibReader compressed_exe;
  PSFFile psf;
  char absolute_path [4096];
  char pwd [4096];
  char basedir [4096];
  string local_3320 [32];
  vector<char,_std::allocator<char>_> *local_3300;
  uint local_32f8 [28];
  ios_base local_3288 [264];
  undefined1 local_3180 [184];
  PSFFile local_30c8;
  string local_3038;
  char acStack_3037 [4095];
  ostringstream local_2038 [4096];
  ostringstream local_1038 [4104];
  
  __nbytes = CONCAT71(in_register_00000009,first_load);
  local_3300 = rom;
  if (9 < lib_nest_level) {
    std::__cxx11::ostringstream::ostringstream(local_2038);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2038,(filename->_M_dataplus)._M_p,
                         filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"Nest level error on psflib loading.",0x23);
    poVar14 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::out_of_range::out_of_range(poVar14,&local_3038);
    __cxa_throw(poVar14,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  uVar16 = __nbytes & 0xffffffff;
  getcwd((char *)local_2038,0x1000);
  __name = (filename->_M_dataplus)._M_p;
  if (__name == (char *)0x0) {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
  }
  else {
    pcVar5 = realpath(__name,(char *)&local_3038);
    if (pcVar5 == (char *)0x0) {
      if (*__name == '/') {
        strcpy((char *)&local_3038,__name);
      }
      else {
        getcwd((char *)&local_3038,0x1000);
        sVar7 = strlen((char *)&local_3038);
        *(undefined2 *)(&local_3038 + sVar7) = 0x2f;
        strcat(acStack_3037 + sVar7,__name);
      }
    }
  }
  if (__name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1038);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1038,(filename->_M_dataplus)._M_p,
                         filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"Unable to determine absolute path.",0x22);
    poVar14 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::out_of_range::out_of_range(poVar14,(string *)local_32f8);
    __cxa_throw(poVar14,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  strcpy((char *)local_1038,(char *)&local_3038);
  dirname((char *)local_1038);
  PSFFile::PSFFile(&local_30c8,filename);
  psVar8 = PSFFile::compressed_exe_abi_cxx11_(&local_30c8);
  pcVar1 = (psVar8->_M_dataplus)._M_p;
  psVar8 = PSFFile::compressed_exe_abi_cxx11_(&local_30c8);
  uVar3 = crc32(0,pcVar1,(int)psVar8->_M_string_length);
  uVar4 = PSFFile::compressed_exe_crc32(&local_30c8);
  if (uVar4 != uVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_32f8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_32f8,(filename->_M_dataplus)._M_p,
                         filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"CRC32 error at the compressed program.",0x26);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,(string *)local_3180);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar18 = 1;
  this_01 = (ostringstream *)local_32f8;
  do {
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"_lib",4);
    if (1 < iVar18) {
      std::ostream::operator<<((ostream *)this_01,iVar18);
    }
    std::__cxx11::stringbuf::str();
    this = &PSFFile::tags_abi_cxx11_(&local_30c8)->_M_h;
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this,(key_type *)local_3180);
    if (cVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      chdir((char *)local_1038);
      this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)PSFFile::tags_abi_cxx11_(&local_30c8);
      filename_00 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](this_00,(key_type *)local_3180);
      uVar15 = (uint)uVar16 & 1;
      __nbytes = (ulong)uVar15;
      load_2sf(filename_00,local_3300,lib_nest_level + 1,SUB41(uVar15,0));
      chdir((char *)local_2038);
      iVar18 = iVar18 + 1;
      uVar16 = 0;
    }
    if ((undefined1 *)local_3180._0_8_ != local_3180 + 0x10) {
      operator_delete((void *)local_3180._0_8_,local_3180._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_3288);
  } while (cVar9.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           ._M_cur != (__node_type *)0x0);
  psVar8 = PSFFile::compressed_exe_abi_cxx11_(&local_30c8);
  pcVar1 = (psVar8->_M_dataplus)._M_p;
  psVar8 = PSFFile::compressed_exe_abi_cxx11_(&local_30c8);
  ZlibReader::ZlibReader((ZlibReader *)local_3180,pcVar1,psVar8->_M_string_length);
  sVar10 = ZlibReader::read((ZlibReader *)local_3180,(int)local_32f8,(void *)0x4,__nbytes);
  if ((int)sVar10 == 4) {
    this_01 = (ostringstream *)(ulong)local_32f8[0];
  }
  sVar11 = ZlibReader::read((ZlibReader *)local_3180,(int)local_32f8,(void *)0x4,__nbytes);
  pvVar2 = local_3300;
  uVar15 = 0;
  if ((int)sVar11 == 4) {
    uVar15 = local_32f8[0];
  }
  if (((int)sVar10 == 4) && ((int)sVar11 == 4)) {
    uVar17 = uVar15 + (int)this_01;
    if (0x8000000 < uVar17) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_32f8);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_32f8,(filename->_M_dataplus)._M_p,
                           filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"Load offset/size of 2SF is too large. ",0x26);
      poVar14 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::out_of_range::out_of_range(poVar14,local_3320);
      __cxa_throw(poVar14,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if ((uVar16 & 1) == 0) {
      if ((ulong)((long)(local_3300->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(local_3300->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start) < (ulong)uVar17) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_32f8);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_32f8,(filename->_M_dataplus)._M_p,
                             filename->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"Load offset/size of 2SF is out of bound.",0x28);
        poVar14 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::out_of_range::out_of_range(poVar14,local_3320);
        __cxa_throw(poVar14,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
    }
    else {
      local_32f8[0] = local_32f8[0] & 0xffffff00;
      std::vector<char,_std::allocator<char>_>::resize
                (local_3300,(ulong)uVar17,(value_type *)local_32f8);
    }
    sVar10 = ZlibReader::read((ZlibReader *)local_3180,
                              (int)this_01 +
                              (int)(pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                                   .super__Vector_impl_data._M_start,(void *)(ulong)uVar15,__nbytes)
    ;
    if ((uint)sVar10 == uVar15) {
      ZlibReader::~ZlibReader((ZlibReader *)local_3180);
      PSFFile::~PSFFile(&local_30c8);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_32f8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_32f8,(filename->_M_dataplus)._M_p,
                         filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"Failed to deflate data. Program data is corrupted.",0x32);
    poVar14 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::out_of_range::out_of_range(poVar14,local_3320);
    __cxa_throw(poVar14,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_32f8);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_32f8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13,"Unable to read the program header.",0x22);
  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar12,local_3320);
  __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load_2sf(const std::string & filename, std::vector<char> & rom, int lib_nest_level = 0, bool first_load = true) {
  // check the psflib nest level
  if (lib_nest_level >= kPSFLibMaxNestLevel) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Nest level error on psflib loading.";
    throw std::out_of_range(message_buffer.str());
  }

  // save the current directory
  char pwd[PATH_MAX];
  getcwd(pwd, PATH_MAX);

  // get the absolute path
  char absolute_path[PATH_MAX];
  if (path_getabspath(filename.c_str(), absolute_path) == NULL) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to determine absolute path.";
    throw std::out_of_range(message_buffer.str());
  }

  // get the directory path
  char basedir[PATH_MAX];
  strcpy(basedir, absolute_path);
  path_dirname(basedir);

  // load the psf file
  PSFFile psf(filename);

  // check CRC32 of the compressed program
  uint32_t actual_crc32 = ::crc32(0L, reinterpret_cast<const Bytef *>(
    psf.compressed_exe().data()), static_cast<uInt>(psf.compressed_exe().size()));
  if (psf.compressed_exe_crc32() != actual_crc32) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "CRC32 error at the compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // load psflibs
  int lib_index = 1;
  while (true) {
    // search for _libN tag
    std::ostringstream lib_tag_name_buffer;
    lib_tag_name_buffer << "_lib";
    if (lib_index > 1) {
      lib_tag_name_buffer << lib_index;
    }
    std::string lib_tag_name = lib_tag_name_buffer.str();

    // if no tag is present, end the lib loading
    if (psf.tags().count(lib_tag_name) == 0) {
      break;
    }

    // set the current directory to the parent psf directory
    chdir(basedir);

    // load the lib
    try {
      load_2sf(psf.tags()[lib_tag_name], rom, lib_nest_level + 1, first_load);
    }
    catch (std::exception) {
      chdir(pwd);
      throw;
    }
    chdir(pwd);
    first_load = false;

    // check the next lib
    lib_index++;
  }

  // read the exe header
  // - 4 bytes offset
  // - 4 bytes size
  ZlibReader compressed_exe(psf.compressed_exe().c_str(), psf.compressed_exe().size());
  uint32_t load_offset;
  uint32_t load_size;
  bool read_success = true;
  read_success &= compressed_exe.readInt(load_offset);
  read_success &= compressed_exe.readInt(load_size);
  if (!read_success) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the program header.";
    throw std::runtime_error(message_buffer.str());
  }

  // ensure the rom buffer size
  if (load_offset + load_size > kNDSRomMaxSize) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Load offset/size of 2SF is too large. ";
    throw std::out_of_range(message_buffer.str());
  }
  if (first_load) {
    rom.resize(load_offset + load_size, 0);
  }
  else {
    if (load_offset + load_size > rom.size()) {
      std::ostringstream message_buffer;
      message_buffer << filename << ": " << "Load offset/size of 2SF is out of bound.";
      throw std::out_of_range(message_buffer.str());
    }
  }

  // decompress the program area
  if (compressed_exe.read(&rom[load_offset], load_size) != load_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Failed to deflate data. Program data is corrupted.";
    throw std::out_of_range(message_buffer.str());
  }
}